

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O2

int * Gia_PermuteSpecialOrder(Gia_Man_t *p)

{
  int Entry;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  int *piVar1;
  int v;
  
  Gia_ManCreateRefs(p);
  p_00 = Vec_IntAlloc(p->vCis->nSize - p->nRegs);
  for (v = 0; v < p->vCis->nSize - p->nRegs; v = v + 1) {
    pObj = Gia_ManCi(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    Entry = Gia_ObjRefNum(p,pObj);
    Vec_IntPush(p_00,Entry);
  }
  piVar1 = Abc_QuickSortCost(p_00->pArray,p_00->nSize,1);
  Vec_IntFree(p_00);
  return piVar1;
}

Assistant:

int * Gia_PermuteSpecialOrder( Gia_Man_t * p )
{
    Vec_Int_t * vPerm;
    Gia_Obj_t * pObj;
    int i, * pOrder;
    Gia_ManCreateRefs( p );
    vPerm = Vec_IntAlloc( Gia_ManPiNum(p) );
    Gia_ManForEachPi( p, pObj, i )
        Vec_IntPush( vPerm, Gia_ObjRefNum(p, pObj) );
    pOrder = Abc_QuickSortCost( Vec_IntArray(vPerm), Vec_IntSize(vPerm), 1 );
    Vec_IntFree( vPerm );
    return pOrder;
}